

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.cpp
# Opt level: O0

void __thiscall ixy::IxgbeDevice::start_tx_queue(IxgbeDevice *this,uint16_t queue_id)

{
  LogData<ixy::Pair<ixy::None,_const_char_*>_> begin;
  undefined8 in_stack_ffffffffffffff88;
  undefined1 local_61;
  LogData<ixy::Pair<ixy::None,_const_char_*>_> local_60;
  reference local_50;
  ixgbe_tx_queue *queue;
  LogData<ixy::Pair<ixy::None,_const_char_*>_> *local_38;
  LogData<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_short_&>_> local_30;
  uint16_t local_12;
  IxgbeDevice *pIStack_10;
  uint16_t queue_id_local;
  IxgbeDevice *this_local;
  
  local_12 = queue_id;
  pIStack_10 = this;
  memset((void *)((long)&queue + 7),0,1);
  local_38 = ixy::operator<<("starting tx queue ");
  begin.list.second = (char *)this;
  begin.list._0_8_ = in_stack_ffffffffffffff88;
  ixy::operator<<(&local_30,begin,(unsigned_short *)local_38);
  debug<ixy::Pair<ixy::Pair<ixy::None,char_const*>,unsigned_short_const&>>
            ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp",
             0x107,"start_tx_queue",&local_30);
  local_50 = std::vector<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>::at
                       (&this->tx_queues,(ulong)local_12);
  if ((local_50->num_entries & local_50->num_entries - 1) != 0) {
    memset(&local_61,0,1);
    local_60.list.second = (char *)ixy::operator<<("number of queue entries must be a power of 2");
    error<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
               ,0x10a,"start_tx_queue",&local_60);
  }
  set_reg32(this,(long)(int)((uint)local_12 * 0x40 + 0x6010),0);
  set_reg32(this,(long)(int)((uint)local_12 * 0x40 + 0x6018),0);
  set_flags32(this,(long)(int)((uint)local_12 * 0x40 + 0x6028),0x2000000);
  wait_set_reg32(this,(long)(int)((uint)local_12 * 0x40 + 0x6028),0x2000000);
  return;
}

Assistant:

void IxgbeDevice::start_tx_queue(uint16_t queue_id) {
    debug("starting tx queue " << queue_id);
    struct ixgbe_tx_queue *queue = &tx_queues.at(queue_id);
    if (queue->num_entries & unsigned(queue->num_entries - 1)) {
        error("number of queue entries must be a power of 2");
    }
    // tx queue starts out empty
    set_reg32(IXGBE_TDH(queue_id), 0);
    set_reg32(IXGBE_TDT(queue_id), 0);
    // enable queue and wait if necessary
    set_flags32(IXGBE_TXDCTL(queue_id), IXGBE_TXDCTL_ENABLE);
    wait_set_reg32(IXGBE_TXDCTL(queue_id), IXGBE_TXDCTL_ENABLE);
}